

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall
QList<QStyleOptionGraphicsItem>::resize(QList<QStyleOptionGraphicsItem> *this,qsizetype size)

{
  Data *pDVar1;
  long lVar2;
  QStyleOptionGraphicsItem *__cur;
  QStyleOptionGraphicsItem *pQVar3;
  
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) ||
      (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     (((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) *
      0x5555555555555555 + (pDVar1->super_QArrayData).alloc < size)) {
    QArrayDataPointer<QStyleOptionGraphicsItem>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(QStyleOptionGraphicsItem **)0x0,
               (QArrayDataPointer<QStyleOptionGraphicsItem> *)0x0);
  }
  else {
    lVar2 = (this->d).size;
    if (size < lVar2) {
      pQVar3 = (this->d).ptr + size;
      lVar2 = lVar2 * 0x60 + size * -0x60;
      do {
        QStyleOption::~QStyleOption(&pQVar3->super_QStyleOption);
        pQVar3 = pQVar3 + 1;
        lVar2 = lVar2 + -0x60;
      } while (lVar2 != 0);
      (this->d).size = size;
    }
  }
  lVar2 = (this->d).size;
  if (lVar2 < size) {
    pQVar3 = (this->d).ptr + lVar2;
    lVar2 = size * 0x60 + lVar2 * -0x60;
    do {
      QStyleOptionGraphicsItem::QStyleOptionGraphicsItem(pQVar3);
      pQVar3 = pQVar3 + 1;
      lVar2 = lVar2 + -0x60;
    } while (lVar2 != 0);
    (this->d).size = size;
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }